

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,uchar *blindout,uint64_t *value_out,
              uchar *message_out,size_t *outlen,uchar *nonce,uint64_t *min_value,uint64_t *max_value
              ,secp256k1_ge *commit,uchar *proof,size_t plen,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_ge *genp)

{
  int iVar1;
  uchar *e0_00;
  uint64_t *local_63b8;
  uint64_t local_63b0;
  uint64_t vv;
  secp256k1_scalar blind;
  secp256k1_fe fe;
  uchar *e0;
  uchar m [33];
  uchar local_6328 [8];
  uchar signs [31];
  uint64_t local_6300;
  uint64_t scale;
  ulong uStack_62f0;
  int offset_post_header;
  size_t npub;
  ulong uStack_62e0;
  int overflow;
  size_t rings;
  size_t offset;
  int mantissa;
  int exp;
  size_t i;
  size_t sStack_62b8;
  int ret;
  size_t rsizes [32];
  undefined1 local_61b0 [8];
  secp256k1_sha256 sha256_m;
  secp256k1_scalar evalues [128];
  secp256k1_scalar s [128];
  undefined1 local_4140 [8];
  secp256k1_ge c;
  secp256k1_gej pubs [128];
  undefined1 local_e0 [8];
  secp256k1_gej accj;
  uchar *nonce_local;
  size_t *outlen_local;
  uchar *message_out_local;
  uint64_t *value_out_local;
  uchar *blindout_local;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_local;
  
  rings = 0;
  accj._120_8_ = nonce;
  iVar1 = secp256k1_rangeproof_getheader_impl
                    (&rings,(int *)((long)&offset + 4),(int *)&offset,&local_6300,min_value,
                     max_value,proof,plen);
  if (iVar1 == 0) {
    ecmult_gen_ctx_local._4_4_ = 0;
  }
  else {
    scale._4_4_ = (int)rings;
    uStack_62e0 = 1;
    sStack_62b8 = 1;
    uStack_62f0 = 1;
    if ((uint)offset != 0) {
      uStack_62e0 = (ulong)((int)(uint)offset >> 1);
      for (_mantissa = 0; _mantissa < uStack_62e0; _mantissa = _mantissa + 1) {
        rsizes[_mantissa - 1] = 4;
      }
      uStack_62f0 = (ulong)(((int)(uint)offset >> 1) << 2);
      if (((uint)offset & 1) != 0) {
        rsizes[uStack_62e0 - 1] = 2;
        uStack_62f0 = rsizes[uStack_62e0 - 1] + uStack_62f0;
        uStack_62e0 = uStack_62e0 + 1;
      }
    }
    if (plen - rings < (uStack_62f0 + uStack_62e0 + -1) * 0x20 + 0x20 + (uStack_62e0 + 6 >> 3)) {
      ecmult_gen_ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_sha256_initialize((secp256k1_sha256 *)local_61b0);
      secp256k1_rangeproof_serialize_point((uchar *)&e0,commit);
      secp256k1_sha256_write((secp256k1_sha256 *)local_61b0,(uchar *)&e0,0x21);
      secp256k1_rangeproof_serialize_point((uchar *)&e0,genp);
      secp256k1_sha256_write((secp256k1_sha256 *)local_61b0,(uchar *)&e0,0x21);
      secp256k1_sha256_write((secp256k1_sha256 *)local_61b0,proof,rings);
      for (_mantissa = 0; _mantissa < uStack_62e0 - 1; _mantissa = _mantissa + 1) {
        local_6328[_mantissa] =
             ((uint)proof[rings + (_mantissa >> 3)] & 1 << ((byte)_mantissa & 7)) != 0;
      }
      rings = (uStack_62e0 + 6 >> 3) + rings;
      if (((uStack_62e0 - 1 & 7) == 0) ||
         ((int)(uint)proof[rings - 1] >> ((char)uStack_62e0 - 1U & 7) == 0)) {
        uStack_62f0 = 0;
        secp256k1_gej_set_infinity((secp256k1_gej *)local_e0);
        if (*min_value != 0) {
          secp256k1_pedersen_ecmult_small((secp256k1_gej *)local_e0,*min_value,genp);
        }
        for (_mantissa = 0; _mantissa < uStack_62e0 - 1; _mantissa = _mantissa + 1) {
          iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)(blind.d + 3),proof + rings);
          if ((iVar1 == 0) ||
             (iVar1 = secp256k1_ge_set_xquad
                                ((secp256k1_ge *)local_4140,(secp256k1_fe *)(blind.d + 3)),
             iVar1 == 0)) {
            return 0;
          }
          if (local_6328[_mantissa] != '\0') {
            secp256k1_ge_neg((secp256k1_ge *)local_4140,(secp256k1_ge *)local_4140);
          }
          secp256k1_sha256_write((secp256k1_sha256 *)local_61b0,local_6328 + _mantissa,1);
          secp256k1_sha256_write((secp256k1_sha256 *)local_61b0,proof + rings,0x20);
          secp256k1_gej_set_ge
                    ((secp256k1_gej *)&pubs[uStack_62f0 + -1].infinity,(secp256k1_ge *)local_4140);
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)local_e0,(secp256k1_gej *)local_e0,(secp256k1_ge *)local_4140,
                     (secp256k1_fe *)0x0);
          rings = rings + 0x20;
          uStack_62f0 = rsizes[_mantissa - 1] + uStack_62f0;
        }
        secp256k1_gej_neg((secp256k1_gej *)local_e0,(secp256k1_gej *)local_e0);
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)&pubs[uStack_62f0 + -1].infinity,(secp256k1_gej *)local_e0,
                   commit,(secp256k1_fe *)0x0);
        iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&pubs[uStack_62f0 + -1].infinity);
        if (iVar1 == 0) {
          secp256k1_rangeproof_pub_expand
                    ((secp256k1_gej *)&c.infinity,offset._4_4_,&stack0xffffffffffff9d48,uStack_62e0,
                     genp);
          uStack_62f0 = rsizes[uStack_62e0 - 2] + uStack_62f0;
          e0_00 = proof + rings;
          for (_mantissa = 0; rings = rings + 0x20, _mantissa < uStack_62f0;
              _mantissa = _mantissa + 1) {
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)(evalues[_mantissa + 0x7f].d + 3),proof + rings,
                       (int *)((long)&npub + 4));
            if (npub._4_4_ != 0) {
              return 0;
            }
          }
          if (rings == plen) {
            if (extra_commit != (uchar *)0x0) {
              secp256k1_sha256_write((secp256k1_sha256 *)local_61b0,extra_commit,extra_commit_len);
            }
            secp256k1_sha256_finalize((secp256k1_sha256 *)local_61b0,(uchar *)&e0);
            if (accj._120_8_ == 0) {
              local_63b8 = (uint64_t *)0x0;
            }
            else {
              local_63b8 = &sha256_m.bytes;
            }
            i._4_4_ = secp256k1_borromean_verify
                                ((secp256k1_scalar *)local_63b8,e0_00,
                                 (secp256k1_scalar *)(evalues[0x7f].d + 3),
                                 (secp256k1_gej *)&c.infinity,&stack0xffffffffffff9d48,uStack_62e0,
                                 (uchar *)&e0,0x20);
            if ((i._4_4_ != 0) && (accj._120_8_ != 0)) {
              if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
                return 0;
              }
              iVar1 = secp256k1_rangeproof_rewind_inner
                                ((secp256k1_scalar *)&vv,&local_63b0,message_out,outlen,
                                 (secp256k1_scalar *)&sha256_m.bytes,
                                 (secp256k1_scalar *)(evalues[0x7f].d + 3),&stack0xffffffffffff9d48,
                                 uStack_62e0,(uchar *)accj._120_8_,commit,proof,(long)scale._4_4_,
                                 genp);
              if (iVar1 == 0) {
                return 0;
              }
              local_63b0 = local_63b0 * local_6300 + *min_value;
              secp256k1_pedersen_ecmult
                        (ecmult_gen_ctx,(secp256k1_gej *)local_e0,(secp256k1_scalar *)&vv,local_63b0
                         ,genp);
              iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)local_e0);
              if (iVar1 != 0) {
                return 0;
              }
              secp256k1_gej_neg((secp256k1_gej *)local_e0,(secp256k1_gej *)local_e0);
              secp256k1_gej_add_ge_var
                        ((secp256k1_gej *)local_e0,(secp256k1_gej *)local_e0,commit,
                         (secp256k1_fe *)0x0);
              iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)local_e0);
              if (iVar1 == 0) {
                return 0;
              }
              if (blindout != (uchar *)0x0) {
                secp256k1_scalar_get_b32(blindout,(secp256k1_scalar *)&vv);
              }
              if (value_out != (uint64_t *)0x0) {
                *value_out = local_63b0;
              }
            }
            ecmult_gen_ctx_local._4_4_ = i._4_4_;
          }
          else {
            ecmult_gen_ctx_local._4_4_ = 0;
          }
        }
        else {
          ecmult_gen_ctx_local._4_4_ = 0;
        }
      }
      else {
        ecmult_gen_ctx_local._4_4_ = 0;
      }
    }
  }
  return ecmult_gen_ctx_local._4_4_;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_pedersen_ecmult_small(&accj, *min_value, genp);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(ecmult_gen_ctx, &accj, &blind, vv, genp);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}